

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O2

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator%=(ZZ<130UL> *this,word wRight)

{
  word local_18;
  
  local_18 = wRight;
  Div(this,&local_18);
  (this->super_WW<130UL>)._words[0] = local_18;
  (this->super_WW<130UL>)._words[1] = 0;
  (this->super_WW<130UL>)._words[2] = 0;
  return this;
}

Assistant:

ZZ& operator%=(word wRight)
	{	
		Div(wRight);
		return operator=(wRight);
	}